

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlWriter::~XmlWriter(XmlWriter *this)

{
  bool bVar1;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  XmlWriter *in_stack_00000020;
  
  while( true ) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(unaff_retaddr);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    endElement(in_stack_00000020);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  return;
}

Assistant:

XmlWriter::~XmlWriter() {
        while( !m_tags.empty() )
            endElement();
    }